

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacProj.cpp
# Opt level: O3

void __thiscall
MacProj::set_outflow_bcs
          (MacProj *this,int level,MultiFab *mac_phi,MultiFab *param_3,MultiFab *param_4,
          MultiFab *param_5)

{
  BoxArray *ba;
  AmrLevel *pAVar1;
  pointer pGVar2;
  long *plVar3;
  pointer pBVar4;
  pointer pBVar5;
  Box *pBVar6;
  int iVar7;
  undefined4 uVar8;
  long lVar9;
  int *piVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  BATType BVar14;
  IndexType IVar15;
  long lVar16;
  int iVar17;
  uint uVar18;
  BATType BVar19;
  ulong uVar20;
  IndexType IVar21;
  long lVar22;
  Box ovlp;
  bool hasOutFlow;
  Box phiBox;
  Box lhs;
  int numOutFlowFaces;
  BoxList phiBoxList;
  BoxList ccBoxList;
  BoxArray uncovered_outflow_ba;
  IntVect low;
  Orientation outFaces [6];
  _Head_base<0UL,_amrex::FabArrayBase_*,_false> local_1e8;
  IndexType IStack_1e0;
  BATType aBStack_1dc [2];
  uint uStack_1d4;
  IndexType local_1d0;
  uint local_1c8;
  bool local_1c1;
  _Head_base<0UL,_amrex::FabArrayBase_*,_false> local_1c0;
  IndexType IStack_1b8;
  BATType BStack_1b4;
  int iStack_1b0;
  IndexType IStack_1ac;
  IndexType IStack_1a8;
  IntVect *local_1a0;
  Box local_198;
  int local_174;
  long local_170;
  Box *local_168;
  FabArrayBase *local_160;
  BoxList local_158;
  BoxList local_138;
  _Head_base<0UL,_amrex::FabArrayBase_*,_false> local_118;
  undefined4 local_110;
  int local_10c [15];
  element_type *local_d0;
  BoxArray local_b0;
  Orientation local_48 [4];
  undefined8 local_38;
  
  local_48[0].val = -1;
  local_48[1].val = 0xffffffff;
  local_48[2].val = 0xffffffff;
  local_48[3].val = 0xffffffff;
  local_38 = 0xffffffffffffffff;
  local_160 = (FabArrayBase *)mac_phi;
  OutFlowBC::GetOutFlowFaces(&local_1c1,local_48,this->phys_bc,&local_174);
  pAVar1 = (this->LevelData).super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
           super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>._M_impl.
           super__Vector_impl_data._M_start[level];
  pGVar2 = (this->parent->super_AmrCore).super_AmrMesh.geom.
           super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
           super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
           super__Vector_impl_data._M_start;
  amrex::BoxList::BoxList(&local_138);
  amrex::BoxList::BoxList(&local_158);
  if (local_174 < 1) {
    local_1c8 = 0;
LAB_0027f405:
    if (local_138.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_138.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      amrex::BoxArray::BoxArray((BoxArray *)&local_118,&local_158);
      amrex::BoxList::clear(&local_158);
      if (0 < (int)local_1c8) {
        local_1a0 = (IntVect *)(ulong)local_1c8;
        lVar12 = 0;
        do {
          amrex::MFIter::MFIter((MFIter *)&local_b0,local_160,'\0');
          while (local_b0.m_bat.m_op.m_bndryReg.m_loshft.vect[2] <
                 local_b0.m_bat.m_op.m_bndryReg.m_hishft.vect[1]) {
            uVar8 = local_b0.m_bat.m_op.m_bndryReg.m_loshft.vect[2];
            if ((long *)local_b0.m_bat.m_op._60_8_ != (long *)0x0) {
              uVar8 = *(int *)(*(long *)local_b0.m_bat.m_op._60_8_ +
                              (long)local_b0.m_bat.m_op.m_bndryReg.m_loshft.vect[2] * 4);
            }
            lVar13 = *(long *)(*(long *)((long)&local_160[1].boxarray.m_bat.m_op + 0xc) +
                              (long)(int)uVar8 * 8);
            amrex::BATransformer::operator()
                      ((Box *)&local_1c0,(BATransformer *)&local_118,
                       (local_d0->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar12);
            IStack_1e0.itype = (uint)*(undefined8 *)(lVar13 + 0x20);
            aBStack_1dc[0] = (BATType)*(undefined8 *)(lVar13 + 0x24);
            aBStack_1dc[1] = (BATType)((ulong)*(undefined8 *)(lVar13 + 0x24) >> 0x20);
            uStack_1d4 = (uint)*(undefined8 *)(lVar13 + 0x2c);
            local_1d0.itype = (uint)((ulong)*(undefined8 *)(lVar13 + 0x2c) >> 0x20);
            local_1e8._M_head_impl._0_4_ = (int)*(undefined8 *)(lVar13 + 0x18);
            local_1e8._M_head_impl._4_4_ = (int)((ulong)*(undefined8 *)(lVar13 + 0x18) >> 0x20);
            iVar17 = (int)local_1c0._M_head_impl;
            if ((int)local_1c0._M_head_impl < (int)local_1e8._M_head_impl) {
              iVar17 = (int)local_1e8._M_head_impl;
            }
            iVar7 = local_1c0._M_head_impl._4_4_;
            if (local_1c0._M_head_impl._4_4_ < local_1e8._M_head_impl._4_4_) {
              iVar7 = local_1e8._M_head_impl._4_4_;
            }
            local_1e8._M_head_impl._4_4_ = iVar7;
            local_1e8._M_head_impl._0_4_ = iVar17;
            IVar15.itype = IStack_1b8.itype;
            if ((int)IStack_1b8.itype < (int)IStack_1e0.itype) {
              IVar15.itype = IStack_1e0.itype;
            }
            IStack_1e0.itype = IVar15.itype;
            BVar14 = BStack_1b4;
            if ((int)aBStack_1dc[0] < (int)BStack_1b4) {
              BVar14 = aBStack_1dc[0];
            }
            aBStack_1dc[0] = BVar14;
            BVar19 = iStack_1b0;
            if ((int)aBStack_1dc[1] < iStack_1b0) {
              BVar19 = aBStack_1dc[1];
            }
            aBStack_1dc[1] = BVar19;
            IVar21.itype = IStack_1ac.itype;
            if ((int)uStack_1d4 < (int)IStack_1ac.itype) {
              IVar21.itype = uStack_1d4;
            }
            uStack_1d4 = IVar21.itype;
            if ((((iVar17 <= (int)BVar14) && (iVar7 <= (int)BVar19)) &&
                ((int)IVar15.itype <= (int)IVar21.itype)) && (local_1d0.itype < 8)) {
              piVar10 = (int *)((long)&local_b0.m_bat.m_op.m_bndryReg.m_loshft + 8);
              if ((long *)local_b0.m_bat.m_op._60_8_ != (long *)0x0) {
                piVar10 = (int *)((long)local_b0.m_bat.m_op.m_bndryReg.m_loshft.vect[2] * 4 +
                                 *(long *)local_b0.m_bat.m_op._60_8_);
              }
              local_1c0._M_head_impl = (FabArrayBase *)0x0;
              amrex::BaseFab<double>::setVal<(amrex::RunOn)0>
                        (*(BaseFab<double> **)
                          (*(long *)((long)&local_160[1].boxarray.m_bat.m_op + 0xc) +
                          (long)*piVar10 * 8),(double *)&local_1c0,(Box *)&local_1e8,(DestComp)0x0,
                         (NumComps)0x1);
            }
            amrex::MFIter::operator++((MFIter *)&local_b0);
          }
          amrex::MFIter::~MFIter((MFIter *)&local_b0);
          lVar12 = lVar12 + 1;
        } while ((IntVect *)lVar12 != local_1a0);
      }
      amrex::BoxArray::~BoxArray((BoxArray *)&local_118);
    }
    if (local_158.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_158.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_158.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_158.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_138.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_start != (Box *)0x0) {
      operator_delete(local_138.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_138.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_138.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return;
  }
  ba = &pAVar1->grids;
  local_168 = (Box *)((long)(pGVar2 + level) + 0xac);
  local_1a0 = (IntVect *)((long)(pGVar2 + level) + 0xb8);
  lVar12 = 0;
  local_1c8 = 0;
LAB_0027ee27:
  iVar17 = local_48[lVar12].val % 3;
  plVar3 = (long *)(pAVar1->grids).m_ref.
                   super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (local_48[lVar12].val < 3) {
    lVar13 = *plVar3;
    if (plVar3[1] != lVar13 && -1 < plVar3[1] - lVar13) {
      lVar22 = 0;
      lVar16 = 0;
      local_170 = lVar12;
      do {
        amrex::BATransformer::operator()((Box *)&local_118,&ba->m_bat,(Box *)(lVar13 + lVar22));
        if (*(int *)((long)&local_118._M_head_impl + (long)iVar17 * 4) ==
            *(int *)((long)&local_168->smallend + (long)iVar17 * 4)) goto LAB_0027ef71;
        lVar16 = lVar16 + 1;
        plVar3 = (long *)(pAVar1->grids).m_ref.
                         super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        lVar13 = *plVar3;
        lVar9 = plVar3[1] - lVar13;
        lVar12 = (lVar9 >> 2) * 0x6db6db6db6db6db7;
        lVar22 = lVar22 + 0x1c;
      } while (lVar12 - lVar16 != 0 && lVar16 <= lVar12);
      lVar12 = local_170;
      if (2 < local_48[local_170].val) goto LAB_0027eefb;
    }
  }
  else {
    lVar13 = *plVar3;
    lVar9 = plVar3[1] - lVar13;
LAB_0027eefb:
    if (0 < lVar9) {
      lVar16 = 0;
      lVar9 = 0;
      local_170 = lVar12;
      do {
        amrex::BATransformer::operator()((Box *)&local_118,&ba->m_bat,(Box *)(lVar13 + lVar16));
        if (local_10c[iVar17] == *(int *)((long)local_1a0->vect + (long)iVar17 * 4))
        goto LAB_0027ef71;
        lVar9 = lVar9 + 1;
        plVar3 = (long *)(pAVar1->grids).m_ref.
                         super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        lVar13 = *plVar3;
        lVar22 = (plVar3[1] - lVar13 >> 2) * 0x6db6db6db6db6db7;
        lVar16 = lVar16 + 0x1c;
        lVar12 = local_170;
      } while (lVar22 - lVar9 != 0 && lVar9 <= lVar22);
    }
  }
  goto LAB_0027f3ea;
LAB_0027ef71:
  pBVar6 = local_168;
  lVar12 = local_170;
  uVar11 = local_48[local_170].val % 3;
  local_1e8._M_head_impl = (FabArrayBase *)0x100000001;
  IStack_1e0.itype = 1;
  aBStack_1dc[0] = null;
  aBStack_1dc[1] = 0;
  uStack_1d4 = 0;
  local_1d0.itype = 0;
  if (local_48[local_170].val - 3U < 3) {
    local_b0.m_bat.m_op.m_bndryReg.m_typ.itype =
         (IndexType)(IndexType)*(int *)((long)&local_168->smallend + 8);
    local_b0.m_bat._0_8_ = *(FabArrayBase **)&local_168->smallend;
    IStack_1b8.itype = *(int *)((long)local_1a0->vect + 8);
    local_1c0._M_head_impl = *(FabArrayBase **)local_1a0->vect;
    IVar15.itype = (local_168->btype).itype;
    uVar20 = CONCAT44(IVar15.itype >> 1,IVar15.itype) & 0x100000001;
    local_198.smallend.vect[0] = (int)uVar20;
    local_198.smallend.vect[1] = (int)(uVar20 >> 0x20);
    local_198.smallend.vect[2] = IVar15.itype >> 2 & 1;
    uVar20 = (ulong)uVar11;
    iVar17 = *(int *)((long)&local_1c0._M_head_impl + uVar20 * 4);
    uVar18 = ~local_198.smallend.vect[uVar20] & 1;
    (&local_b0.m_bat.m_bat_type)[uVar20] = uVar18 + iVar17;
    *(uint *)((long)&local_1c0._M_head_impl + uVar20 * 4) = uVar18 + iVar17 + 1;
    local_118._M_head_impl = (FabArrayBase *)local_b0.m_bat._0_8_;
    local_110 = local_b0.m_bat.m_op.m_bndryReg.m_typ.itype;
    local_10c[2] = IStack_1b8.itype;
    local_10c[0] = (int)local_1c0._M_head_impl;
    local_10c[1] = (int)((ulong)local_1c0._M_head_impl >> 0x20);
    local_1e8._M_head_impl = (FabArrayBase *)local_b0.m_bat._0_8_;
    IStack_1e0.itype = (uint)local_b0.m_bat.m_op.m_bndryReg.m_typ.itype;
    aBStack_1dc[0] = local_10c[0];
    aBStack_1dc[1] = local_10c[1];
    uStack_1d4 = IStack_1b8.itype;
    local_1d0.itype = IVar15.itype & ~(1 << (uVar11 & 0x1f));
    iVar17 = -2;
  }
  else {
    local_b0.m_bat.m_op.m_bndryReg.m_typ.itype =
         (IndexType)(IndexType)*(int *)((long)&local_168->smallend + 8);
    local_b0.m_bat._0_8_ = *(FabArrayBase **)&local_168->smallend;
    IStack_1b8.itype = *(int *)((long)local_1a0->vect + 8);
    local_1c0._M_head_impl = *(FabArrayBase **)local_1a0->vect;
    uVar20 = (ulong)(int)uVar11;
    BVar14 = (&local_b0.m_bat.m_bat_type)[uVar20];
    (&local_b0.m_bat.m_bat_type)[uVar20] = BVar14 - coarsenRatio;
    *(BATType *)((long)&local_1c0._M_head_impl + uVar20 * 4) = BVar14 - indexType;
    local_110 = local_b0.m_bat.m_op.m_bndryReg.m_typ.itype;
    local_118._M_head_impl = (FabArrayBase *)local_b0.m_bat._0_8_;
    local_10c[2] = IStack_1b8.itype;
    local_10c[0] = (int)local_1c0._M_head_impl;
    local_10c[1] = (int)((ulong)local_1c0._M_head_impl >> 0x20);
    local_1e8._M_head_impl = (FabArrayBase *)local_b0.m_bat._0_8_;
    IStack_1e0.itype = (uint)local_b0.m_bat.m_op.m_bndryReg.m_typ.itype;
    aBStack_1dc[0] = local_10c[0];
    aBStack_1dc[1] = local_10c[1];
    uStack_1d4 = IStack_1b8.itype;
    local_1d0.itype = (pBVar6->btype).itype & ~(1 << (uVar11 & 0x1f));
    iVar17 = 2;
  }
  piVar10 = (int *)((long)&local_1e8._M_head_impl + uVar20 * 4);
  local_1e8._M_head_impl = (FabArrayBase *)local_b0.m_bat._0_8_;
  IStack_1e0.itype = (uint)local_b0.m_bat.m_op.m_bndryReg.m_typ.itype;
  aBStack_1dc[0] = local_10c[0];
  aBStack_1dc[1] = local_10c[1];
  uStack_1d4 = IStack_1b8.itype;
  local_118._M_head_impl = (FabArrayBase *)local_b0.m_bat._0_8_;
  local_110 = local_b0.m_bat.m_op.m_bndryReg.m_typ.itype;
  local_10c[2] = (int)IStack_1b8;
  *piVar10 = *piVar10 + iVar17;
  aBStack_1dc[uVar20] = aBStack_1dc[uVar20] + iVar17;
  if (local_138.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_138.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<amrex::Box,std::allocator<amrex::Box>>::_M_realloc_insert<amrex::Box_const&>
              ((vector<amrex::Box,std::allocator<amrex::Box>> *)&local_138,
               (iterator)
               local_138.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data._M_finish,(Box *)&local_1e8);
  }
  else {
    *(ulong *)((local_138.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                super__Vector_impl_data._M_finish)->bigend).vect =
         CONCAT44(aBStack_1dc[1],aBStack_1dc[0]);
    *(ulong *)(((local_138.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_finish)->bigend).vect + 2) =
         CONCAT44(local_1d0.itype,uStack_1d4);
    *(FabArrayBase **)
     ((local_138.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_finish)->smallend).vect = local_1e8._M_head_impl;
    *(ulong *)(((local_138.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_finish)->smallend).vect + 2) =
         CONCAT44(aBStack_1dc[0],IStack_1e0.itype);
    local_138.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_138.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  uVar11 = local_48[lVar12].val % 3;
  local_110 = *(int *)((long)&pBVar6->smallend + 8);
  local_118._M_head_impl = *(FabArrayBase **)&pBVar6->smallend;
  local_b0.m_bat.m_op.m_bndryReg.m_typ.itype =
       (IndexType)(IndexType)*(int *)((long)local_1a0->vect + 8);
  local_b0.m_bat._0_8_ = *(undefined8 *)local_1a0->vect;
  if (local_48[lVar12].val < 3) {
    lVar13 = (long)(int)uVar11;
    BVar14 = *(int *)((long)&local_118._M_head_impl + lVar13 * 4) - indexType;
    *(BATType *)((long)&local_118._M_head_impl + lVar13 * 4) = BVar14;
    (&local_b0.m_bat.m_bat_type)[lVar13] = BVar14;
    IStack_1a8.itype = (pBVar6->btype).itype;
  }
  else {
    IStack_1a8.itype = (pBVar6->btype).itype;
    uVar20 = CONCAT44(IStack_1a8.itype >> 1,IStack_1a8.itype) & 0x100000001;
    local_198.smallend.vect[0] = (int)uVar20;
    local_198.smallend.vect[1] = (int)(uVar20 >> 0x20);
    local_198.smallend.vect[2] = IStack_1a8.itype >> 2 & 1;
    uVar20 = (ulong)uVar11;
    BVar14 = (~local_198.smallend.vect[uVar20] & 1U) + (&local_b0.m_bat.m_bat_type)[uVar20];
    *(BATType *)((long)&local_118._M_head_impl + uVar20 * 4) = BVar14;
    (&local_b0.m_bat.m_bat_type)[uVar20] = BVar14;
  }
  IStack_1a8.itype = IStack_1a8.itype & ~(1 << (uVar11 & 0x1f));
  IStack_1b8.itype = local_110;
  local_1c0._M_head_impl = local_118._M_head_impl;
  IStack_1ac.itype = (uint)local_b0.m_bat.m_op.m_bndryReg.m_typ.itype;
  BStack_1b4 = local_b0.m_bat.m_bat_type;
  iStack_1b0 = local_b0.m_bat.m_op._0_4_;
  if (local_158.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_158.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<amrex::Box,std::allocator<amrex::Box>>::_M_realloc_insert<amrex::Box_const&>
              ((vector<amrex::Box,std::allocator<amrex::Box>> *)&local_158,
               (iterator)
               local_158.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data._M_finish,(Box *)&local_1c0);
  }
  else {
    *(undefined8 *)
     ((local_158.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_finish)->bigend).vect = local_b0.m_bat._0_8_;
    *(ulong *)(((local_158.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_finish)->bigend).vect + 2) =
         CONCAT44(IStack_1a8.itype,local_b0.m_bat.m_op.m_bndryReg.m_typ.itype);
    *(FabArrayBase **)
     ((local_158.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_finish)->smallend).vect = local_118._M_head_impl;
    *(ulong *)(((local_158.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_finish)->smallend).vect + 2) =
         CONCAT44(BStack_1b4,local_110);
    local_158.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_158.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_198.smallend.vect[0] = (int)local_1e8._M_head_impl;
  iVar17 = (pBVar6->smallend).vect[0];
  if ((pBVar6->smallend).vect[0] < local_198.smallend.vect[0]) {
    iVar17 = local_198.smallend.vect[0];
  }
  local_198.smallend.vect[1] = (int)((ulong)local_1e8._M_head_impl >> 0x20);
  iVar7 = *(int *)((long)&pBVar6->smallend + 4);
  if (iVar7 < local_198.smallend.vect[1]) {
    iVar7 = local_198.smallend.vect[1];
  }
  local_198.smallend.vect[1] = iVar7;
  local_198.smallend.vect[0] = iVar17;
  local_198.smallend.vect[2] = *(int *)((long)&pBVar6->smallend + 8);
  if (local_198.smallend.vect[2] < (int)IStack_1e0.itype) {
    local_198.smallend.vect[2] = (int)IStack_1e0;
  }
  local_198.bigend.vect[0] = (pBVar6->bigend).vect[0];
  if ((int)aBStack_1dc[0] < local_198.bigend.vect[0]) {
    local_198.bigend.vect[0] = aBStack_1dc[0];
  }
  local_198.bigend.vect[1] = *(int *)((long)&pBVar6->bigend + 4);
  if ((int)aBStack_1dc[1] < local_198.bigend.vect[1]) {
    local_198.bigend.vect[1] = aBStack_1dc[1];
  }
  local_198.bigend.vect[2] = *(int *)((long)&pBVar6->bigend + 8);
  if ((int)uStack_1d4 < local_198.bigend.vect[2]) {
    local_198.bigend.vect[2] = uStack_1d4;
  }
  local_198.btype.itype = local_1d0.itype;
  amrex::complementIn((BoxArray *)&local_118,&local_198,ba);
  if ((local_d0->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      (local_d0->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    amrex::intersect(&local_b0,ba,&local_198,0);
    pBVar4 = ((local_b0.m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pBVar5 = ((local_b0.m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
             super__Vector_impl_data._M_start;
    amrex::BoxArray::~BoxArray(&local_b0);
    if (pBVar4 != pBVar5) {
      amrex::Error_host("MacProj: Cannot yet handle partially refined outflow");
    }
  }
  local_1c8 = local_1c8 + 1;
  amrex::BoxArray::~BoxArray((BoxArray *)&local_118);
LAB_0027f3ea:
  lVar12 = lVar12 + 1;
  if (local_174 <= lVar12) goto LAB_0027f405;
  goto LAB_0027ee27;
}

Assistant:

void
MacProj::set_outflow_bcs (int             level,
                          MultiFab*       mac_phi,
                          const MultiFab* /*u_mac*/,
                          const MultiFab& /*S*/,
                          const MultiFab& /*divu*/)
{
    //
    // This code is very similar to the outflow BC stuff in the Projection
    // class except that here the the phi to be solved for lives on the
    // out-directed faces.  The projection equation to satisfy is
    //
    //   (1/r)(d/dr)[r/rho dphi/dr] = dv/dr - S
    //
    bool hasOutFlow;
    Orientation outFaces[2*BL_SPACEDIM];
    int numOutFlowFaces;

    OutFlowBC::GetOutFlowFaces(hasOutFlow,outFaces,phys_bc,numOutFlowFaces);

    const BoxArray&   grids  = LevelData[level]->boxArray();
    const Geometry&   geom   = parent->Geom(level);
    const Box&        domain = parent->Geom(level).Domain();
    //
    // Create 1-wide cc box just outside boundary to hold phi.
    //
    BoxList ccBoxList, phiBoxList;
    // numOutFlowFaces gives the number of outflow faces on the entire
    //   problem domain
    // nOutFlowTouched gives the number of outflow faces a level touches, so
    //   nOutFlowTouched = numOutFlowFaces for level 0, but
    //   nOutFlowTouched <= numOutFlowFaces for levels > 0, since
    //   finer levels may not span the entire problem domain
    int nOutFlowTouched = 0;
    for (int iface = 0; iface < numOutFlowFaces; iface++)
    {
        if (grids_on_side_of_domain(grids,geom.Domain(),outFaces[iface]))
        {
            nOutFlowTouched++;
            const int outDir    = outFaces[iface].coordDir();

            Box ccBndBox;
            if (outFaces[iface].faceDir() == Orientation::high)
            {
                ccBndBox = amrex::adjCellHi(domain,outDir,2);
                ccBndBox.shift(outDir,-2);
            }
            else
            {
                ccBndBox = amrex::adjCellLo(domain,outDir,2);
                ccBndBox.shift(outDir,2);
            }
            ccBoxList.push_back(ccBndBox);

            Box phiBox  = amrex::adjCell(domain,outFaces[iface],1);
            phiBoxList.push_back(phiBox);

            const Box&     valid_ccBndBox       = ccBndBox & domain;
            const BoxArray uncovered_outflow_ba = amrex::complementIn(valid_ccBndBox,grids);

            if (uncovered_outflow_ba.size() &&
                amrex::intersect(grids,valid_ccBndBox).size())
                amrex::Error("MacProj: Cannot yet handle partially refined outflow");
        }
    }

    if ( !ccBoxList.isEmpty() )
    {
        BoxArray phiBoxArray(phiBoxList);
        phiBoxList.clear();

        //
        // Must do this kind of copy instead of mac_phi->copy(phidat);
        // because we're copying onto the ghost cells of the FABs,
        // not the valid regions.
        //
#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for ( int iface = 0; iface < nOutFlowTouched; ++iface )
        {
            for (MFIter mfi(*mac_phi); mfi.isValid(); ++mfi)
            {
                Box ovlp = (*mac_phi)[mfi].box() & phiBoxArray[iface];
                if (ovlp.ok()) {
                      (*mac_phi)[mfi].setVal<RunOn::Gpu>(0,ovlp,0,1);
                }
            }
        }
    }
}